

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O3

bool __thiscall
jsonnet::internal::FixNewlines::shouldExpand(FixNewlines *this,ArrayComprehension *comp)

{
  Kind KVar1;
  pointer pFVar2;
  uint uVar3;
  const_iterator __end2;
  AST *pAVar4;
  pointer pCVar5;
  ostream *poVar6;
  const_iterator __begin2;
  pointer pFVar7;
  int iVar8;
  const_iterator __begin2_1;
  int iVar9;
  
  pAVar4 = left_recursive_deep(comp->body);
  pFVar7 = (pAVar4->openFodder).
           super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pFVar2 = (pAVar4->openFodder).
           super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pFVar7 != pFVar2) {
    iVar8 = 0;
    do {
      KVar1 = pFVar7->kind;
      if (KVar1 == PARAGRAPH) {
        iVar9 = (int)((ulong)((long)(pFVar7->comment).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(pFVar7->comment).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 5) + pFVar7->blanks
        ;
      }
      else {
        iVar9 = 0;
        if (KVar1 != INTERSTITIAL) {
          if (KVar1 != LINE_END) goto LAB_00169022;
          iVar9 = 1;
        }
      }
      iVar8 = iVar8 + iVar9;
      pFVar7 = pFVar7 + 1;
    } while (pFVar7 != pFVar2);
    uVar3 = 1;
    if (0 < iVar8) goto LAB_00169020;
  }
  for (pCVar5 = (comp->specs).
                super__Vector_base<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pCVar5 != (comp->specs).
                super__Vector_base<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
                ._M_impl.super__Vector_impl_data._M_finish; pCVar5 = pCVar5 + 1) {
    pFVar7 = (pCVar5->openFodder).
             super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pFVar2 = (pCVar5->openFodder).
             super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pFVar7 != pFVar2) {
      iVar8 = 0;
      do {
        KVar1 = pFVar7->kind;
        if (KVar1 == PARAGRAPH) {
          iVar9 = (int)((ulong)((long)(pFVar7->comment).
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(pFVar7->comment).
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 5) +
                  pFVar7->blanks;
        }
        else {
          iVar9 = 0;
          if (KVar1 != INTERSTITIAL) {
            if (KVar1 != LINE_END) goto LAB_00169022;
            iVar9 = 1;
          }
        }
        iVar8 = iVar8 + iVar9;
        pFVar7 = pFVar7 + 1;
      } while (pFVar7 != pFVar2);
      if (0 < iVar8) {
        uVar3 = 1;
        goto LAB_00169020;
      }
    }
  }
  pFVar7 = (comp->closeFodder).
           super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pFVar2 = (comp->closeFodder).
           super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar3 = 0;
  if (pFVar7 != pFVar2) {
    do {
      KVar1 = pFVar7->kind;
      if (KVar1 == PARAGRAPH) {
        iVar8 = (int)((ulong)((long)(pFVar7->comment).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(pFVar7->comment).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 5) + pFVar7->blanks
        ;
      }
      else {
        iVar8 = 0;
        if (KVar1 != INTERSTITIAL) {
          if (KVar1 != LINE_END) {
LAB_00169022:
            poVar6 = std::operator<<((ostream *)&std::cerr,"Unknown FodderElement kind");
            std::endl<char,std::char_traits<char>>(poVar6);
            abort();
          }
          iVar8 = 1;
        }
      }
      uVar3 = uVar3 + iVar8;
      pFVar7 = pFVar7 + 1;
    } while (pFVar7 != pFVar2);
    uVar3 = (uint)(0 < (int)uVar3);
  }
LAB_00169020:
  return SUB41(uVar3,0);
}

Assistant:

bool shouldExpand(ArrayComprehension *comp)
    {
        if (countNewlines(open_fodder(comp->body)) > 0) {
            return true;
        }
        for (auto &spec : comp->specs) {
            if (countNewlines(spec.openFodder) > 0) {
                return true;
            }
        }
        if (countNewlines(comp->closeFodder) > 0) {
            return true;
        }
        return false;
    }